

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  mapped_type mVar1;
  __node_ptr p_Var2;
  short sVar3;
  short sVar4;
  size_t inst_offset;
  undefined4 endian;
  bool bVar5;
  spv_result_t sVar6;
  spv_operand_type_t type;
  Op opcode;
  spv_operand_type_t sVar7;
  spv_ext_inst_type_t sVar8;
  int32_t iVar9;
  uint32_t uVar10;
  DiagnosticStream *pDVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  iterator iVar14;
  iterator iVar15;
  undefined8 uVar16;
  mapped_type *pmVar17;
  __node_ptr p_Var18;
  pointer __s;
  _Hash_node_base *p_Var19;
  __hash_code __c;
  __node_ptr p_Var20;
  ulong uVar21;
  size_type __n;
  ulong uVar22;
  ushort uVar23;
  int i;
  uint uVar24;
  uint16_t uVar25;
  int iVar26;
  spv_operand_type_t sVar27;
  char *pcVar28;
  spv_operand_type_t *types;
  spv_parsed_header_fn_t p_Var29;
  long lVar30;
  Op OVar31;
  Op OVar32;
  Op operand;
  long lVar33;
  undefined1 auVar34 [16];
  uint16_t inst_word_count;
  spv_parsed_operand_t local_460;
  size_t local_450;
  ulong local_448;
  uint32_t first_word;
  uint32_t word;
  spv_opcode_desc opcode_entry;
  ulong local_430;
  spv_parsed_instruction_t inst;
  spv_opcode_desc opcode_desc;
  size_t local_3e0;
  undefined1 local_3d8 [24];
  spv_ext_inst_table local_3c0;
  MessageConsumer *local_3b8;
  void *local_3b0;
  spv_parsed_header_fn_t local_3a8;
  spv_parsed_instruction_fn_t local_3a0;
  undefined1 local_398 [160];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2f8;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> local_290;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_3;
  uint auStack_230 [110];
  spv_result_t local_78;
  spv_context_t hijack_context;
  
  p_Var29 = parsed_header;
  local_450 = num_words;
  spv_context_t::spv_context_t(&hijack_context,context);
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context,diagnostic);
  }
  local_3b8 = &hijack_context.consumer;
  local_3d8._0_4_ = hijack_context.target_env;
  local_3d8._8_8_ = hijack_context.operand_table;
  local_3d8._16_4_ = (int)hijack_context.opcode_table;
  local_3d8._20_4_ = hijack_context.opcode_table._4_4_;
  local_3c0 = hijack_context.ext_inst_table;
  local_3b0 = user_data;
  local_3a8 = parsed_header;
  local_3a0 = parsed_instruction;
  anon_unknown.dwarf_15d176c::Parser::State::State((State *)local_398);
  anon_unknown.dwarf_15d176c::Parser::State::State((State *)&entry_3,code,local_450,diagnostic);
  anon_unknown.dwarf_15d176c::Parser::State::operator=((State *)local_398,(State *)&entry_3);
  anon_unknown.dwarf_15d176c::Parser::State::~State((State *)&entry_3);
  if ((uint *)local_398._0_8_ == (uint *)0x0) {
    anon_unknown.dwarf_15d176c::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    pcVar28 = "Missing module.";
LAB_00246abe:
    std::operator<<((ostream *)&entry_3,pcVar28);
    sVar6 = local_78;
  }
  else if ((ulong)local_398._8_8_ < 5) {
    anon_unknown.dwarf_15d176c::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    std::operator<<((ostream *)&entry_3,"Module has incomplete header: only ");
    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
    std::operator<<((ostream *)&entry_3," words instead of ");
    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
    sVar6 = local_78;
  }
  else {
    binary.code = (uint32_t *)local_398._0_8_;
    binary.wordCount = local_398._8_8_;
    sVar6 = spvBinaryEndianness(&binary,(spv_endianness_t *)(local_398 + 0x28));
    if (sVar6 == SPV_SUCCESS) {
      local_398[0x2c] = spvIsHostEndian(local_398._40_4_);
      local_398[0x2c] = !local_398[0x2c];
      sVar6 = spvBinaryHeaderGet(&binary,local_398._40_4_,&header);
      if (sVar6 == SPV_SUCCESS) {
        if (local_3a8 == (spv_parsed_header_fn_t)0x0) {
LAB_00246c79:
          local_398._24_8_ = 5;
LAB_00246c9c:
          if ((ulong)local_398._24_8_ < (ulong)local_398._8_8_) {
            local_398._32_8_ = local_398._32_8_ + 1;
            inst.type_id = 0;
            inst.result_id = 0;
            inst.operands = (spv_parsed_operand_t *)0x0;
            inst.words = (uint32_t *)0x0;
            inst.num_words = 0;
            inst.opcode = 0;
            inst.ext_inst_type = SPV_EXT_INST_TYPE_NONE;
            inst.num_operands = 0;
            inst._34_6_ = 0;
            first_word = anon_unknown.dwarf_15d176c::Parser::peek((Parser *)local_3d8);
            if (local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_398 + 0xf0),
                       &first_word);
            if (local_2c0.
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_2c0.
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_2c0.
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_2c0.
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if ((ulong)local_398._8_8_ <= (ulong)local_398._24_8_) {
              __assert_fail("_.word_index < _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                            ,0x138,"spv_result_t (anonymous namespace)::Parser::parseInstruction()")
              ;
            }
            inst_word_count = 0;
            spvOpcodeSplit(first_word,&inst_word_count,&inst.opcode);
            if (inst_word_count == 0) {
              anon_unknown.dwarf_15d176c::Parser::diagnostic
                        ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
              std::operator<<((ostream *)&entry_3,"Invalid instruction word count: ");
              uVar25 = inst_word_count;
LAB_00246dc8:
              std::ostream::operator<<(&entry_3,uVar25);
              sVar6 = local_78;
LAB_00246dda:
              spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
            }
            else {
              sVar6 = spvtools::AssemblyGrammar::lookupOpcode
                                ((AssemblyGrammar *)local_3d8,(uint)inst.opcode,&opcode_desc);
              if (sVar6 != SPV_SUCCESS) {
                anon_unknown.dwarf_15d176c::Parser::diagnostic
                          ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                std::operator<<((ostream *)&entry_3,"Invalid opcode: ");
                uVar25 = inst.opcode;
                goto LAB_00246dc8;
              }
              local_450 = local_398._24_8_;
              local_3e0 = local_398._24_8_ + 1;
              if (local_290.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_290.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                local_290.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_290.
                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              iVar26 = -1;
              local_398._24_8_ = local_3e0;
              for (uVar24 = 0; uVar24 < opcode_desc->numTypes; uVar24 = uVar24 + 1) {
                std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
                          ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                           (local_398 + 0x108),
                           opcode_desc->operandTypes + (int)((uint)opcode_desc->numTypes + iVar26));
                iVar26 = iVar26 + -1;
              }
              do {
                inst_offset = local_450;
                uVar13 = (ulong)inst_word_count;
                uVar21 = local_450 + uVar13;
                if (uVar21 <= (ulong)local_398._24_8_) {
                  if (local_290.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_290.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0024795b:
                    if (uVar21 == local_398._24_8_) {
                      __c = (long)local_2a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_2a8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                      if (local_398[0x2c] == true) {
                        __c = (long)__c >> 2;
                        if (__c != uVar13) {
                          __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                        ,0x180,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                      }
                      else if (__c != 4) {
                        __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x182,
                                      "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                     );
                      }
                      uVar25 = inst.opcode;
                      OVar31 = (Op)inst.opcode;
                      iVar9 = spvOpcodeGeneratesType(OVar31);
                      if (iVar9 == 0) goto LAB_00247dc7;
                      iVar26 = 3;
                      if (OVar31 == OpTypeFloat) {
LAB_00247bda:
                        uVar10 = anon_unknown.dwarf_15d176c::Parser::peekAt
                                           ((Parser *)local_3d8,local_450 + 2);
                      }
                      else {
                        uVar10 = 0;
                        iVar26 = 0;
                        if (uVar25 == 0x15) {
                          uVar10 = anon_unknown.dwarf_15d176c::Parser::peekAt
                                             ((Parser *)local_3d8,local_450 + 3);
                          iVar26 = 2 - (uint)(uVar10 == 0);
                          goto LAB_00247bda;
                        }
                      }
                      local_448 = CONCAT44(local_448._4_4_,iVar26);
                      uVar13 = (ulong)inst.result_id;
                      uVar21 = uVar13 % (ulong)local_398._112_8_;
                      p_Var18 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::_M_find_node((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                *)(local_398 + 0x68),uVar21,&inst.result_id,__c);
                      if (p_Var18 != (__node_ptr)0x0) goto LAB_00247db5;
                      local_3e0 = CONCAT44(local_3e0._4_4_,uVar10);
                      p_Var18 = (__node_ptr)operator_new(0x18);
                      (p_Var18->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                      (p_Var18->
                      super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                      ._M_storage._M_storage.__align =
                           (anon_struct_4_0_00000001_for___align)inst.result_id;
                      *(undefined8 *)
                       ((long)&(p_Var18->
                               super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                               ._M_storage._M_storage + 4) = 0;
                      auVar34 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                          ((ulong)(local_398 + 0x88),local_398._112_8_,
                                           local_398._128_8_);
                      __n = auVar34._8_8_;
                      if ((auVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                      goto LAB_00247d4d;
                      if (__n == 1) {
                        local_398._152_8_ = (__node_base_ptr)0x0;
                        __s = (pointer)(local_398 + 0x98);
                      }
                      else {
                        __s = std::
                              allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                              allocate((allocator_type *)&entry_3,__n);
                        memset(__s,0,__n * 8);
                      }
                      p_Var2 = (__node_ptr)local_398._120_8_;
                      local_398._120_8_ = (__node_ptr)0x0;
                      uVar21 = 0;
                      goto LAB_00247cb5;
                    }
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid word count: Op");
                    pDVar11 = spvtools::DiagnosticStream::operator<<
                                        ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                    std::operator<<((ostream *)pDVar11," starting at word ");
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar11);
                    std::operator<<((ostream *)pDVar11," says it has ");
                    std::ostream::operator<<(pDVar11,inst_word_count);
                    std::operator<<((ostream *)pDVar11," words, but found ");
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar11);
                    pcVar28 = " words instead.";
                  }
                  else {
                    bVar5 = spvOperandIsOptional
                                      (local_290.
                                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish[-1]);
                    if (bVar5) {
                      uVar13 = (ulong)inst_word_count;
                      uVar21 = inst_offset + uVar13;
                      goto LAB_0024795b;
                    }
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"End of input reached while decoding Op");
                    pDVar11 = spvtools::DiagnosticStream::operator<<
                                        ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                    std::operator<<((ostream *)pDVar11," starting at word ");
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar11);
                    std::operator<<((ostream *)pDVar11,": expected more operands after ");
                    std::ostream::operator<<(pDVar11,inst_word_count);
                    pcVar28 = " words.";
                  }
                  std::operator<<((ostream *)pDVar11,pcVar28);
                  sVar6 = pDVar11->error_;
                  goto LAB_00246dda;
                }
                iVar26 = (int)local_450;
                if (local_290.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_290.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  sVar4 = (short)local_450;
                  sVar3 = (short)local_398._24_8_;
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                  std::operator<<((ostream *)&entry_3,"Invalid instruction Op");
                  pDVar11 = spvtools::DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&entry_3,&opcode_desc->name);
                  std::operator<<((ostream *)pDVar11," starting at word ");
                  std::ostream::_M_insert<unsigned_long>((ulong)pDVar11);
                  std::operator<<((ostream *)pDVar11,": expected no more operands after ");
                  std::ostream::operator<<(pDVar11,sVar3 - sVar4);
                  std::operator<<((ostream *)pDVar11," words, but stated word count is ");
                  std::ostream::operator<<(pDVar11,inst_word_count);
                  std::operator<<((ostream *)pDVar11,".");
                  sVar6 = pDVar11->error_;
                  goto LAB_00246dda;
                }
                type = spvTakeFirstMatchableOperand
                                 ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *
                                  )(local_398 + 0x108));
                sVar6 = (int)local_398._24_8_ - iVar26;
                uVar25 = (uint16_t)sVar6;
                local_460.num_words = 1;
                local_460.number_kind = SPV_NUMBER_NONE;
                local_460.number_bit_width = 0;
                OVar31 = (Op)inst.opcode;
                local_460.offset = uVar25;
                local_460.type = type;
                if ((ulong)local_398._8_8_ <= (ulong)local_398._24_8_) {
                  sVar6 = anon_unknown.dwarf_15d176c::Parser::exhaustedInputDiagnostic
                                    ((Parser *)local_3d8,inst_offset,OVar31,type);
                  goto LAB_00247923;
                }
                opcode = anon_unknown.dwarf_15d176c::Parser::peek((Parser *)local_3d8);
                local_448 = (ulong)opcode;
                word = opcode;
                switch(type) {
                case SPV_OPERAND_TYPE_ID:
                case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                  if (opcode != OpNop) {
                    local_460.type = SPV_OPERAND_TYPE_ID;
                    bVar5 = spvIsExtendedInstruction(OVar31);
                    if (uVar25 == 3 && bVar5) {
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_398 + 0xa0),&word);
                      if (iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        anon_unknown.dwarf_15d176c::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,
                                   SPV_ERROR_INVALID_ID);
                        std::operator<<((ostream *)&entry_3,"OpExtInst set Id ");
                        std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                        pcVar28 = " does not reference an OpExtInstImport result Id";
                        break;
                      }
                      inst.ext_inst_type =
                           *(spv_ext_inst_type_t *)
                            ((long)iVar15.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                                   ._M_cur + 0xc);
                    }
                    goto LAB_0024784f;
                  }
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID);
                  pcVar28 = "Id is 0";
                  break;
                case SPV_OPERAND_TYPE_TYPE_ID:
                  if (opcode != OpNop) {
                    inst.type_id = opcode;
                    goto LAB_0024784f;
                  }
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID);
                  pcVar28 = "Error: Type Id is 0";
                  break;
                case SPV_OPERAND_TYPE_RESULT_ID:
                  if (opcode == OpNop) {
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID
                              );
                    pcVar28 = "Error: Result Id is 0";
                  }
                  else {
                    inst.result_id = opcode;
                    iVar14 = std::
                             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)(local_398 + 0x30),&inst.result_id);
                    if (iVar14.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur == (__node_type *)0x0) {
                      iVar9 = spvOpcodeGeneratesType(OVar31);
                      mVar1 = (&inst.type_id)[iVar9 != 0];
                      pmVar12 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)(local_398 + 0x30),&inst.result_id);
                      *pmVar12 = mVar1;
                      goto LAB_0024784f;
                    }
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INVALID_ID
                              );
                    std::operator<<((ostream *)&entry_3,"Id ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    pcVar28 = " is defined more than once";
                  }
                  break;
                case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                case SPV_OPERAND_TYPE_SCOPE_ID:
                  if (opcode != OpNop) goto LAB_0024784f;
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                  pcVar28 = spvOperandTypeStr(type);
                  std::operator<<((ostream *)&entry_3,pcVar28);
                  pcVar28 = " is 0";
                  break;
                case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                  uVar16 = 0x100000006;
                  goto LAB_002476aa;
                case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                  bVar5 = spvIsExtendedInstruction(OVar31);
                  if (!bVar5) {
                    __assert_fail("spvIsExtendedInstruction(opcode)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x1f1,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (inst.ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
                    __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x1f2,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  sVar6 = spvtools::AssemblyGrammar::lookupExtInst
                                    ((AssemblyGrammar *)local_3d8,inst.ext_inst_type,opcode,
                                     (spv_ext_inst_desc *)&opcode_entry);
                  if (sVar6 == SPV_SUCCESS) {
                    types = (spv_operand_type_t *)&opcode_entry->numTypes;
LAB_0024784a:
                    spvPushOperandTypes(types,(spv_operand_pattern_t *)(local_398 + 0x108));
                  }
                  else {
                    bVar5 = spvExtInstIsNonSemantic(inst.ext_inst_type);
                    if (!bVar5) {
                      anon_unknown.dwarf_15d176c::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      pcVar28 = "Invalid extended instruction number: ";
                      goto LAB_00247354;
                    }
                    entry_3._0_4_ = 0x34;
                    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                    emplace_back<spv_operand_type_t>
                              ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)
                               (local_398 + 0x108),(spv_operand_type_t *)&entry_3);
                  }
                  goto LAB_0024784f;
                case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                  if (OVar31 != OpSpecConstantOp) {
                    __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x207,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (((int)opcode < 0) ||
                     (sVar6 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                        ((AssemblyGrammar *)local_3d8,opcode), sVar6 != SPV_SUCCESS)
                     ) {
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid ");
                    pcVar28 = spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
                    std::operator<<((ostream *)&entry_3,pcVar28);
                    pcVar28 = ": ";
                    goto LAB_00247354;
                  }
                  opcode_entry = (spv_opcode_desc)0x0;
                  sVar6 = spvtools::AssemblyGrammar::lookupOpcode
                                    ((AssemblyGrammar *)local_3d8,opcode,&opcode_entry);
                  if (sVar6 == SPV_SUCCESS) {
                    if (opcode_entry->hasType == false) {
                      __assert_fail("opcode_entry->hasType",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x215,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (opcode_entry->hasResult == false) {
                      __assert_fail("opcode_entry->hasResult",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x216,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (opcode_entry->numTypes < 2) {
                      __assert_fail("opcode_entry->numTypes >= 2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x217,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    types = opcode_entry->operandTypes + 2;
                    goto LAB_0024784a;
                  }
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INTERNAL);
                  pcVar28 = "OpSpecConstant opcode table out of sync";
                  break;
                case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                  local_460.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                  if ((OVar31 == OpConstant) || (OVar31 == OpSpecConstant)) {
                    if (inst.type_id == 0) {
                      __assert_fail("inst->type_id",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x24d,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar6 = anon_unknown.dwarf_15d176c::Parser::setNumericTypeInfoForType
                                      ((Parser *)local_3d8,&local_460,inst.type_id);
                    if (sVar6 == SPV_SUCCESS) goto LAB_0024784f;
                    goto LAB_00247923;
                  }
                  if (OVar31 != OpSwitch) {
                    __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x24a,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  uVar10 = anon_unknown.dwarf_15d176c::Parser::peekAt((Parser *)local_3d8,local_3e0)
                  ;
                  opcode_entry = (spv_opcode_desc)CONCAT44(opcode_entry._4_4_,uVar10);
                  iVar14 = std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)(local_398 + 0x30),(key_type_conflict *)&opcode_entry);
                  if ((iVar14.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur == (__node_type *)0x0) ||
                     (uVar10 = *(uint32_t *)
                                ((long)iVar14.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                       ._M_cur + 0xc), uVar10 == 0)) {
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    pcVar28 = " has no type";
                  }
                  else if ((uint32_t)opcode_entry == uVar10) {
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    pcVar28 = " is a type, not a value";
                  }
                  else {
                    sVar6 = anon_unknown.dwarf_15d176c::Parser::setNumericTypeInfoForType
                                      ((Parser *)local_3d8,&local_460,uVar10);
                    if (sVar6 != SPV_SUCCESS) goto LAB_00247923;
                    if (0xfffffffd < local_460.number_kind - SPV_NUMBER_FLOATING) goto LAB_0024784f;
                    anon_unknown.dwarf_15d176c::Parser::diagnostic
                              ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                    std::operator<<((ostream *)&entry_3,"Invalid OpSwitch: selector id ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                    pcVar28 = " is not a scalar integer";
                  }
                  break;
                case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                  uVar16 = 0x30000000a;
LAB_002476aa:
                  local_460.type = (spv_operand_type_t)uVar16;
                  local_460.number_kind = (spv_number_kind_t)((ulong)uVar16 >> 0x20);
                  local_460.number_bit_width = 0x20;
                  goto LAB_0024784f;
                case SPV_OPERAND_TYPE_LITERAL_STRING:
                case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                  lVar30 = local_398._8_8_ - local_398._24_8_;
                  spvtools::utils::MakeString<unsigned_int_const*>
                            ((string *)&opcode_entry,
                             (utils *)(local_398._0_8_ + local_398._24_8_ * 4),
                             (uint *)(local_398._0_8_ + local_398._8_8_ * 4),(uint *)0x0,
                             SUB81(p_Var29,0));
                  if (local_430 == lVar30 * 4) {
                    sVar6 = anon_unknown.dwarf_15d176c::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3d8,local_450,OVar31,type);
LAB_00246fb1:
                    bVar5 = false;
                  }
                  else {
                    uVar23 = (short)(local_430 >> 2) + 1;
                    if (0x3fffb < local_430) {
                      anon_unknown.dwarf_15d176c::Parser::diagnostic
                                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                      std::operator<<((ostream *)&entry_3,"Literal string is longer than ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      std::operator<<((ostream *)&entry_3," words: ");
                      std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                      pcVar28 = " words long";
LAB_00246f9d:
                      std::operator<<((ostream *)&entry_3,pcVar28);
                      sVar6 = local_78;
                      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
                      goto LAB_00246fb1;
                    }
                    local_460.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                    bVar5 = true;
                    local_460.num_words = uVar23;
                    if (OVar31 == OpExtInstImport) {
                      sVar8 = spvExtInstImportTypeGet((char *)opcode_entry);
                      if (sVar8 == SPV_EXT_INST_TYPE_NONE) {
                        anon_unknown.dwarf_15d176c::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                        std::operator<<((ostream *)&entry_3,"Invalid extended instruction import \'"
                                       );
                        std::operator<<((ostream *)&entry_3,(string *)&opcode_entry);
                        pcVar28 = "\'";
                        goto LAB_00246f9d;
                      }
                      if (inst.result_id == 0) {
                        __assert_fail("inst->result_id",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x276,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      pmVar17 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)(local_398 + 0xa0),&inst.result_id);
                      *pmVar17 = sVar8;
                    }
                  }
                  std::__cxx11::string::_M_dispose();
                  if (!bVar5) goto LAB_00247923;
                  goto LAB_0024784f;
                case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                  sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                    ((AssemblyGrammar *)local_3d8,SPV_OPERAND_TYPE_SOURCE_LANGUAGE,
                                     opcode,(spv_operand_desc *)&opcode_entry);
                  if (sVar6 == SPV_SUCCESS) {
LAB_0024783e:
                    types = opcode_entry->operandTypes + 3;
                    goto LAB_0024784a;
                  }
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                  std::operator<<((ostream *)&entry_3,"Invalid ");
                  pcVar28 = spvOperandTypeStr(SPV_OPERAND_TYPE_SOURCE_LANGUAGE);
                  std::operator<<((ostream *)&entry_3,pcVar28);
                  std::operator<<((ostream *)&entry_3," operand: ");
                  std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                  pcVar28 = 
                  ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                  ;
                  break;
                case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                case SPV_OPERAND_TYPE_MEMORY_MODEL:
                case SPV_OPERAND_TYPE_EXECUTION_MODE:
                case SPV_OPERAND_TYPE_STORAGE_CLASS:
                case SPV_OPERAND_TYPE_DIMENSIONALITY:
                case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                case SPV_OPERAND_TYPE_DECORATION:
                case SPV_OPERAND_TYPE_BUILT_IN:
                case SPV_OPERAND_TYPE_GROUP_OPERATION:
                case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                case SPV_OPERAND_TYPE_CAPABILITY:
                case SPV_OPERAND_TYPE_FPENCODING:
                case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                case SPV_OPERAND_TYPE_FPDENORM_MODE:
                case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                case SPV_OPERAND_TYPE_RAY_FLAGS:
                case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                  sVar7 = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
                  if (type == SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) {
LAB_002472f6:
                    sVar27 = sVar7;
                    local_460.type = sVar7;
                  }
                  else {
                    if (type == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                      sVar7 = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
                      goto LAB_002472f6;
                    }
                    sVar7 = SPV_OPERAND_TYPE_FPENCODING;
                    sVar27 = type;
                    if (type == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) goto LAB_002472f6;
                  }
                  sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                    ((AssemblyGrammar *)local_3d8,type,opcode,
                                     (spv_operand_desc *)&opcode_entry);
                  if (sVar6 == SPV_SUCCESS) goto LAB_0024783e;
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                  std::operator<<((ostream *)&entry_3,"Invalid ");
                  pcVar28 = spvOperandTypeStr(sVar27);
                  std::operator<<((ostream *)&entry_3,pcVar28);
                  pcVar28 = " operand: ";
LAB_00247354:
                  std::operator<<((ostream *)&entry_3,pcVar28);
                  std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                  goto LAB_00247366;
                default:
                  anon_unknown.dwarf_15d176c::Parser::diagnostic
                            ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                  std::operator<<((ostream *)&entry_3,"Internal error: Unhandled operand type: ");
                  std::ostream::operator<<((DiagnosticStream *)&entry_3,type);
                  goto LAB_00247366;
                case SPV_OPERAND_TYPE_IMAGE:
                case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                case SPV_OPERAND_TYPE_LOOP_CONTROL:
                case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                  sVar7 = SPV_OPERAND_TYPE_IMAGE;
                  sVar27 = sVar7;
                  if (type != SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                    if (type == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      sVar7 = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                      sVar27 = sVar7;
                    }
                    else if (type == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      sVar7 = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                      sVar27 = sVar7;
                    }
                    else {
                      sVar7 = type;
                      sVar27 = local_460.type;
                      if (type == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                        sVar7 = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                        sVar27 = sVar7;
                      }
                    }
                  }
                  local_460.type = sVar27;
                  operand = ~Max;
                  OVar32 = opcode;
                  while (OVar32 != OpNop) {
                    if ((OVar32 & operand) != OpNop) {
                      sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                        ((AssemblyGrammar *)local_3d8,type,operand,
                                         (spv_operand_desc *)&opcode_entry);
                      if (sVar6 != SPV_SUCCESS) {
                        anon_unknown.dwarf_15d176c::Parser::diagnostic
                                  ((DiagnosticStream *)&entry_3,(Parser *)local_3d8);
                        std::operator<<((ostream *)&entry_3,"Invalid ");
                        pcVar28 = spvOperandTypeStr(sVar7);
                        std::operator<<((ostream *)&entry_3,pcVar28);
                        std::operator<<((ostream *)&entry_3," operand: ");
                        std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                        std::operator<<((ostream *)&entry_3," has invalid mask component ");
                        std::ostream::_M_insert<unsigned_long>((ulong)&entry_3);
                        sVar6 = local_78;
                        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
                        goto LAB_00247923;
                      }
                      OVar32 = OVar32 ^ operand;
                      spvPushOperandTypes(opcode_entry->operandTypes + 3,
                                          (spv_operand_pattern_t *)(local_398 + 0x108));
                    }
                    operand = operand >> 1;
                  }
                  if ((opcode == OpNop) &&
                     (sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                        ((AssemblyGrammar *)local_3d8,type,0,&entry_3),
                     sVar6 == SPV_SUCCESS)) {
                    types = (spv_operand_type_t *)(CONCAT44(entry_3._4_4_,(uint32_t)entry_3) + 0x28)
                    ;
                    goto LAB_0024784a;
                  }
LAB_0024784f:
                  bVar5 = spvOperandIsConcrete(local_460.type);
                  if (!bVar5) {
                    __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x303,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::
                  push_back((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *)
                            (local_398 + 0xd8),&local_460);
                  endian = local_398._40_4_;
                  uVar16 = local_398._0_8_;
                  uVar21 = local_398._24_8_ + (ulong)local_460.num_words;
                  if ((ulong)local_398._8_8_ < uVar21) {
                    sVar6 = anon_unknown.dwarf_15d176c::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3d8,local_450,OVar31,type);
                  }
                  else {
                    if (local_398[0x2c] == true) {
                      lVar33 = local_398._24_8_ * 4;
                      uVar13 = (ulong)local_460.num_words;
                      for (lVar30 = 0; uVar13 * 4 != lVar30; lVar30 = lVar30 + 4) {
                        entry_3._0_4_ = spvFixWord(*(uint32_t *)(uVar16 + lVar30 + lVar33),endian);
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        emplace_back<unsigned_int>
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   (local_398 + 0xf0),(uint *)&entry_3);
                      }
                    }
                    sVar6 = SPV_SUCCESS;
                    local_398._24_8_ = uVar21;
                  }
                  goto LAB_00247923;
                }
                std::operator<<((ostream *)&entry_3,pcVar28);
LAB_00247366:
                sVar6 = local_78;
                spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
LAB_00247923:
              } while (sVar6 == SPV_SUCCESS);
            }
            goto LAB_00246ddf;
          }
          sVar6 = SPV_SUCCESS;
          if (local_398._24_8_ != local_398._8_8_) {
            __assert_fail("_.word_index == _.num_words",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                          ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
          }
          goto LAB_00246b67;
        }
        p_Var29 = (spv_parsed_header_fn_t)(ulong)header.generator;
        sVar6 = (*local_3a8)(local_3b0,local_398._40_4_,header.magic,header.version,header.generator
                             ,header.bound,header.schema);
        if (sVar6 == SPV_SUCCESS) goto LAB_00246c79;
        goto LAB_00246b67;
      }
      anon_unknown.dwarf_15d176c::Parser::diagnostic
                ((DiagnosticStream *)&entry_3,(Parser *)local_3d8,SPV_ERROR_INTERNAL);
      pcVar28 = "Internal error: unhandled header parse failure";
      goto LAB_00246abe;
    }
    anon_unknown.dwarf_15d176c::Parser::diagnostic((DiagnosticStream *)&entry_3,(Parser *)local_3d8)
    ;
    std::operator<<((ostream *)&entry_3,"Invalid SPIR-V magic number \'");
    lVar30 = *(long *)(CONCAT44(entry_3._4_4_,(uint32_t)entry_3) + -0x18);
    *(uint *)((long)auStack_230 + lVar30) = *(uint *)((long)auStack_230 + lVar30) & 0xffffffb5 | 8;
    pDVar11 = spvtools::DiagnosticStream::operator<<
                        ((DiagnosticStream *)&entry_3,(uint *)local_398._0_8_);
    std::operator<<((ostream *)pDVar11,"\'.");
    sVar6 = pDVar11->error_;
  }
  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_3);
LAB_00246b67:
  anon_unknown.dwarf_15d176c::Parser::State::State((State *)&entry_3);
  anon_unknown.dwarf_15d176c::Parser::State::operator=((State *)local_398,(State *)&entry_3);
  anon_unknown.dwarf_15d176c::Parser::State::~State((State *)&entry_3);
  anon_unknown.dwarf_15d176c::Parser::State::~State((State *)local_398);
  if (hijack_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijack_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijack_context.consumer,(_Any_data *)&hijack_context.consumer,
               __destroy_functor);
  }
  return sVar6;
LAB_00247cb5:
  uVar22 = uVar21;
  p_Var20 = p_Var2;
  if (p_Var20 != (__node_ptr)0x0) {
    p_Var2 = (__node_ptr)(p_Var20->super__Hash_node_base)._M_nxt;
    uVar21 = (ulong)(uint)(p_Var20->
                          super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                          ._M_storage._M_storage.__align % __n;
    if (__s[uVar21] == (_Hash_node_base *)0x0) goto LAB_00247ce5;
    (p_Var20->super__Hash_node_base)._M_nxt = __s[uVar21]->_M_nxt;
    p_Var19 = __s[uVar21];
    uVar21 = uVar22;
    goto LAB_00247d16;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_deallocate_buckets
            ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_398 + 0x68));
  uVar21 = uVar13 % __n;
  local_398._104_8_ = __s;
  local_398._112_8_ = __n;
LAB_00247d4d:
  if (*(pointer)(local_398._104_8_ + uVar21 * 8) == (_Hash_node_base *)0x0) {
    (p_Var18->super__Hash_node_base)._M_nxt = (_Hash_node_base *)local_398._120_8_;
    if ((__node_ptr)local_398._120_8_ != (__node_ptr)0x0) {
      *(__node_ptr *)
       (local_398._104_8_ +
       ((ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        *)(local_398._120_8_ + 8))->
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                     )._M_storage._M_storage.__align % (ulong)local_398._112_8_) * 8) = p_Var18;
    }
    *(undefined1 **)(local_398._104_8_ + uVar21 * 8) = local_398 + 0x78;
    local_398._120_8_ = p_Var18;
  }
  else {
    (p_Var18->super__Hash_node_base)._M_nxt = (*(pointer)(local_398._104_8_ + uVar21 * 8))->_M_nxt;
    (*(pointer)(local_398._104_8_ + uVar21 * 8))->_M_nxt = (_Hash_node_base *)p_Var18;
  }
  local_398._128_8_ = local_398._128_8_ + 1;
  uVar10 = (uint32_t)local_3e0;
LAB_00247db5:
  *(undefined4 *)
   ((long)&(p_Var18->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 4) = (undefined4)local_448;
  *(uint32_t *)
   ((long)&(p_Var18->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 8) = uVar10;
LAB_00247dc7:
  inst.words = local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (local_398[0x2c] == false) {
    inst.words = (uint32_t *)(local_398._0_8_ + local_450 * 4);
  }
  inst.num_words = inst_word_count;
  inst.operands =
       local_2c0.super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
       _M_impl.super__Vector_impl_data._M_start;
  inst.num_operands =
       (uint16_t)
       ((uint)((int)local_2c0.
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (int)local_2c0.
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) >> 4);
  if ((local_3a0 == (spv_parsed_instruction_fn_t)0x0) ||
     (sVar6 = (*local_3a0)(local_3b0,&inst), sVar6 == SPV_SUCCESS)) {
    sVar6 = SPV_SUCCESS;
  }
LAB_00246ddf:
  if (sVar6 != SPV_SUCCESS) goto LAB_00246b67;
  goto LAB_00246c9c;
LAB_00247ce5:
  (p_Var20->super__Hash_node_base)._M_nxt = (_Hash_node_base *)local_398._120_8_;
  __s[uVar21] = (_Hash_node_base *)(local_398 + 0x78);
  local_398._120_8_ = p_Var20;
  if ((p_Var20->super__Hash_node_base)._M_nxt != (_Hash_node_base *)0x0) {
    p_Var19 = (_Hash_node_base *)(__s + uVar22);
LAB_00247d16:
    p_Var19->_M_nxt = &p_Var20->super__Hash_node_base;
  }
  goto LAB_00247cb5;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}